

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_choice(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  LY_ERR LVar1;
  LY_ERR local_3c;
  lysp_node *plStack_38;
  LY_ERR ret;
  lysp_node *child_p;
  lysc_node_choice *ch;
  lysp_node_choice *ch_p;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  if (node->nodetype != 2) {
    __assert_fail("node->nodetype == LYS_CHOICE",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xe7e,
                  "LY_ERR lys_compile_node_choice(struct lysc_ctx *, struct lysp_node *, struct lysc_node *)"
                 );
  }
  plStack_38 = pnode[1].parent;
  while( true ) {
    if (plStack_38 == (lysp_node *)0x0) {
      local_3c = lys_compile_node_augments(ctx,node);
      if ((local_3c == LY_SUCCESS) && (pnode[1].next != (lysp_node *)0x0)) {
        local_3c = lys_compile_node_choice_dflt
                             (ctx,(lysp_qname *)&pnode[1].next,(lysc_node_choice *)node);
      }
      return local_3c;
    }
    LVar1 = lys_compile_node_choice_child(ctx,plStack_38,node,(ly_set *)0x0);
    if (LVar1 != LY_SUCCESS) break;
    plStack_38 = plStack_38->next;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lys_compile_node_choice(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_choice *ch_p = (struct lysp_node_choice *)pnode;
    struct lysc_node_choice *ch = (struct lysc_node_choice *)node;
    struct lysp_node *child_p;
    LY_ERR ret = LY_SUCCESS;

    assert(node->nodetype == LYS_CHOICE);

    LY_LIST_FOR(ch_p->child, child_p) {
        LY_CHECK_GOTO(ret = lys_compile_node_choice_child(ctx, child_p, node, NULL), done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    /* default branch */
    if (ch_p->dflt.str) {
        LY_CHECK_GOTO(ret = lys_compile_node_choice_dflt(ctx, &ch_p->dflt, ch), done);
    }

done:
    return ret;
}